

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O1

FormattedNumber * __thiscall
icu_63::number::FormattedNumber::operator=(FormattedNumber *this,FormattedNumber *src)

{
  UFormattedNumberData *this_00;
  FormattedNumber *p;
  
  this_00 = this->fResults;
  if (this_00 != (UFormattedNumberData *)0x0) {
    p = src;
    impl::NumberStringBuilder::~NumberStringBuilder(&this_00->string);
    impl::DecimalQuantity::~DecimalQuantity(&this_00->quantity);
    UMemory::operator_delete((UMemory *)this_00,p);
  }
  this->fResults = src->fResults;
  this->fErrorCode = src->fErrorCode;
  src->fResults = (UFormattedNumberData *)0x0;
  src->fErrorCode = U_INVALID_STATE_ERROR;
  return this;
}

Assistant:

FormattedNumber& FormattedNumber::operator=(FormattedNumber&& src) U_NOEXCEPT {
    delete fResults;
    fResults = src.fResults;
    fErrorCode = src.fErrorCode;
    // Disown src.fResults to prevent double-deletion
    src.fResults = nullptr;
    src.fErrorCode = U_INVALID_STATE_ERROR;
    return *this;
}